

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

bool __thiscall Gluco::SimpSolver::implied(SimpSolver *this,vec<Gluco::Lit> *c)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Lit p;
  CRef CVar4;
  Lit *pLVar5;
  bool result;
  lbool local_41;
  int local_40;
  lbool local_3a;
  lbool local_39;
  int local_38;
  lbool local_32;
  lbool local_31;
  int local_30;
  lbool local_29;
  int local_28;
  int local_24;
  int i;
  vec<Gluco::Lit> *c_local;
  SimpSolver *this_local;
  
  _i = c;
  c_local = (vec<Gluco::Lit> *)this;
  iVar2 = Solver::decisionLevel(&this->super_Solver);
  if (iVar2 != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                  ,0x14b,"bool Gluco::SimpSolver::implied(const vec<Lit> &)");
  }
  local_24 = vec<Gluco::Lit>::size(&(this->super_Solver).trail);
  vec<int>::push(&(this->super_Solver).trail_lim,&local_24);
  local_28 = 0;
  while( true ) {
    iVar2 = local_28;
    iVar3 = vec<Gluco::Lit>::size(_i);
    if (iVar3 <= iVar2) {
      CVar4 = Solver::propagate(&this->super_Solver);
      Solver::cancelUntil(&this->super_Solver,0);
      return CVar4 != 0xffffffff;
    }
    pLVar5 = vec<Gluco::Lit>::operator[](_i,local_28);
    local_30 = pLVar5->x;
    local_29 = Solver::value(&this->super_Solver,(Lit)local_30);
    lbool::lbool(&local_31,'\0');
    bVar1 = lbool::operator==(&local_29,local_31);
    if (bVar1) break;
    pLVar5 = vec<Gluco::Lit>::operator[](_i,local_28);
    local_38 = pLVar5->x;
    local_32 = Solver::value(&this->super_Solver,(Lit)local_38);
    lbool::lbool(&local_39,'\x01');
    bVar1 = lbool::operator!=(&local_32,local_39);
    if (bVar1) {
      pLVar5 = vec<Gluco::Lit>::operator[](_i,local_28);
      local_40 = pLVar5->x;
      local_3a = Solver::value(&this->super_Solver,(Lit)local_40);
      lbool::lbool(&local_41,'\x02');
      bVar1 = lbool::operator==(&local_3a,local_41);
      if (!bVar1) {
        __assert_fail("value(c[i]) == l_Undef",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                      ,0x153,"bool Gluco::SimpSolver::implied(const vec<Lit> &)");
      }
      pLVar5 = vec<Gluco::Lit>::operator[](_i,local_28);
      p = operator~(pLVar5->x);
      Solver::uncheckedEnqueue(&this->super_Solver,p,0xffffffff);
    }
    local_28 = local_28 + 1;
  }
  Solver::cancelUntil(&this->super_Solver,0);
  return false;
}

Assistant:

bool SimpSolver::implied(const vec<Lit>& c)
{
    assert(decisionLevel() == 0);

    trail_lim.push(trail.size());
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True){
            cancelUntil(0);
            return false;
        }else if (value(c[i]) != l_False){
            assert(value(c[i]) == l_Undef);
            uncheckedEnqueue(~c[i]);
        }

    bool result = propagate() != CRef_Undef;
    cancelUntil(0);
    return result;
}